

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O1

void __thiscall libtorrent::dht::observer::set_target(observer *this,endpoint *ep)

{
  byte bVar1;
  ushort uVar2;
  undefined8 uVar3;
  rep rVar4;
  bad_address_cast ex;
  bad_address_cast local_18;
  
  rVar4 = ::std::chrono::_V2::system_clock::now();
  (this->m_sent).__d.__r = rVar4;
  uVar2 = (ep->impl_).data_.v4.sin_port;
  this->m_port = uVar2 << 8 | uVar2 >> 8;
  bVar1 = (this->flags).m_val;
  if ((ep->impl_).data_.base.sa_family == 2) {
    (this->flags).m_val = bVar1 & 0xdf;
    if ((ep->impl_).data_.base.sa_family != 2) {
      local_18 = (bad_address_cast)&PTR__bad_cast_004ee530;
      boost::throw_exception<boost::asio::ip::bad_address_cast>(&local_18);
    }
    *(in_addr_t *)(this->m_addr).v4._M_elems = (ep->impl_).data_.v4.sin_addr.s_addr;
  }
  else {
    (this->flags).m_val = bVar1 | 0x20;
    if ((ep->impl_).data_.base.sa_family == 2) {
      local_18 = (bad_address_cast)&PTR__bad_cast_004ee530;
      boost::throw_exception<boost::asio::ip::bad_address_cast>(&local_18);
    }
    uVar3 = *(undefined8 *)((long)&(ep->impl_).data_ + 0x10);
    *(undefined8 *)&this->m_addr = *(undefined8 *)((long)&(ep->impl_).data_ + 8);
    *(undefined8 *)((long)&this->m_addr + 8) = uVar3;
  }
  return;
}

Assistant:

void observer::set_target(udp::endpoint const& ep)
{
	m_sent = clock_type::now();

	m_port = ep.port();
	if (aux::is_v6(ep))
	{
		flags |= flag_ipv6_address;
		m_addr.v6 = ep.address().to_v6().to_bytes();
	}
	else
	{
		flags &= ~flag_ipv6_address;
		m_addr.v4 = ep.address().to_v4().to_bytes();
	}
}